

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O2

void dyn_tbl_print(dyn_tbl_t *dyn_tbl,char *output)

{
  uint32_t ip;
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  __node_base *p_Var3;
  char addr2 [30];
  char addr1 [30];
  
  __stream = fopen(output,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"length: %u\n",(ulong)(uint)(dyn_tbl->array)._M_h._M_element_count);
    p_Var3 = &(dyn_tbl->array)._M_h._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      if (dyn_tbl->lgn == 0x20) {
        pcVar1 = ip2a((uint32_t)*(size_type *)(p_Var3 + 1),addr1);
        fprintf(__stream,"%s %lld\n",pcVar1,p_Var3[3]._M_nxt);
      }
      else {
        ip = *(uint32_t *)((long)(p_Var3 + 1) + 4);
        pcVar1 = ip2a((uint32_t)*(size_type *)(p_Var3 + 1),addr1);
        pcVar2 = ip2a(ip,addr2);
        fprintf(__stream,"%s %s %lld\n",pcVar1,pcVar2,p_Var3[3]._M_nxt);
      }
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"ERR: cannot open %s\n",output);
  exit(-1);
}

Assistant:

void dyn_tbl_print(dyn_tbl_t* dyn_tbl, const char* output) {
	FILE* fp;

	// open a file
	if ((fp = fopen(output, "w")) == NULL) {
		fprintf(stderr, "ERR: cannot open %s\n", output);
		exit(-1);
	}

	unsigned int len = dyn_tbl->array.size();
	fprintf(fp, "length: %u\n", len);
	// for(std::unordered_map<dyn_tbl_key_t, long long>::iterator it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
	for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
		dyn_tbl_key_t key = it->first;
		if (dyn_tbl->lgn == 32) {
			char addr1[30];
			unsigned int* ptr = (unsigned int*)key.key;
			fprintf(fp, "%s %lld\n", ip2a(*ptr, addr1), it->second);
		}
		else {
			char addr1[30];
			char addr2[30];
			unsigned int* ptr = (unsigned int*)key.key;
			fprintf(fp, "%s %s %lld\n", ip2a(*ptr, addr1), ip2a(*(ptr + 1), addr2), it->second);
		}
	}

	// close the file
	fclose(fp);
}